

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADABUMathQuaternion.cpp
# Opt level: O2

void COLLADABU::Math::Quaternion::intermediate
               (Quaternion *rkQ0,Quaternion *rkQ1,Quaternion *rkQ2,Quaternion *rkA,Quaternion *rkB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar4;
  uint uVar5;
  undefined4 uVar6;
  uint uVar7;
  Quaternion rkP1;
  Quaternion rkP0;
  Quaternion local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Quaternion local_f8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  Quaternion local_70;
  Quaternion local_50;
  
  local_50.w = rkQ0->w;
  local_50.x._0_4_ = *(undefined4 *)&rkQ0->x;
  local_50.y._0_4_ = *(undefined4 *)&rkQ0->y;
  local_50.x._4_4_ = *(uint *)((long)&rkQ0->x + 4) ^ 0x80000000;
  local_50.y._4_4_ = *(uint *)((long)&rkQ0->y + 4) ^ 0x80000000;
  local_50.z = -rkQ0->z;
  local_70.w = rkQ1->w;
  local_70.x._0_4_ = *(undefined4 *)&rkQ1->x;
  local_70.y._0_4_ = *(undefined4 *)&rkQ1->y;
  local_70.x._4_4_ = *(uint *)((long)&rkQ1->x + 4) ^ 0x80000000;
  local_70.y._4_4_ = *(uint *)((long)&rkQ1->y + 4) ^ 0x80000000;
  local_70.z = -rkQ1->z;
  operator*(&local_50,rkQ1);
  operator*(&local_70,rkQ2);
  dVar1 = log((Quaternion *)local_118,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  log(&local_138,dVar1);
  dVar1 = ((double)local_118._0_8_ - local_138.w) * 0.25;
  dVar2 = ((double)local_118._8_8_ - local_138.x) * 0.25;
  uVar4 = SUB84(dVar2,0);
  uVar5 = (uint)((ulong)dVar2 >> 0x20);
  local_d8._8_4_ = uVar4;
  local_d8._0_8_ = dVar1;
  local_d8._12_4_ = uVar5;
  dVar2 = ((double)local_108._0_8_ - local_138.y) * 0.25;
  dVar3 = ((double)local_108._8_8_ - local_138.z) * 0.25;
  uVar6 = SUB84(dVar3,0);
  uVar7 = (uint)((ulong)dVar3 >> 0x20);
  local_c8._8_4_ = uVar6;
  local_c8._0_8_ = dVar2;
  local_c8._12_4_ = uVar7;
  dVar1 = -dVar1;
  local_118._8_4_ = uVar4;
  local_118._0_8_ = dVar1;
  local_118._12_4_ = uVar5 ^ 0x80000000;
  local_108._8_4_ = uVar6;
  local_108._0_8_ = -dVar2;
  local_108._12_4_ = uVar7 ^ 0x80000000;
  exp(&local_f8,dVar1);
  operator*(rkQ1,&local_f8);
  rkA->w = local_138.w;
  rkA->x = local_138.x;
  rkA->y = local_138.y;
  rkA->z = local_138.z;
  exp(&local_f8,local_138.y);
  operator*(rkQ1,&local_f8);
  rkB->w = local_138.w;
  rkB->x = local_138.x;
  rkB->y = local_138.y;
  rkB->z = local_138.z;
  return;
}

Assistant:

void Quaternion::intermediate ( const Quaternion& rkQ0,
                                        const Quaternion& rkQ1, const Quaternion& rkQ2,
                                        Quaternion& rkA, Quaternion& rkB )
        {
            // assert:  q0, q1, q2 are unit quaternions

            Quaternion kQ0inv = rkQ0.unitInverse();
            Quaternion kQ1inv = rkQ1.unitInverse();
            Quaternion rkP0 = kQ0inv * rkQ1;
            Quaternion rkP1 = kQ1inv * rkQ2;
            Quaternion kArg = 0.25 * ( rkP0.log() - rkP1.log() );
            Quaternion kMinusArg = -kArg;

            rkA = rkQ1 * kArg.exp();
            rkB = rkQ1 * kMinusArg.exp();
        }